

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::COBImporter::CanRead(COBImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  char *tokens [1];
  string local_48;
  char *local_28;
  
  BaseImporter::GetExtension(&local_48,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  bVar1 = true;
  if (iVar2 == 0) goto LAB_004764fa;
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar2 == 0) goto LAB_004764fa;
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar2 == 0) goto LAB_004764fa;
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar2 == 0) goto LAB_004764fa;
  if (local_48._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_004764c9;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_004764c9:
    local_28 = "Caligary";
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_28,1,200,false,false);
    goto LAB_004764fa;
  }
  bVar1 = false;
LAB_004764fa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool COBImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == "cob" || extension == "scn" || extension == "COB" || extension == "SCN") {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        const char* tokens[] = {"Caligary"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}